

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  pointer ppVVar1;
  PcodeOp *pPVar2;
  uint4 uVar3;
  uint uVar4;
  ulong uVar5;
  Varnode *pVVar6;
  
  ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(op->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3);
  if ((int)uVar4 < 1) {
    return 0;
  }
  uVar5 = 0;
  uVar3 = 0;
  do {
    pVVar6 = ppVVar1[uVar5];
    while ((pVVar6->flags & 1) == 0) {
      if ((pVVar6->flags & 0x10) == 0) goto LAB_002e346c;
      pPVar2 = pVVar6->def;
      if (pPVar2 == op) break;
      if (pPVar2->opcode->opcode != CPUI_INDIRECT) goto LAB_002e346c;
      pVVar6 = *(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    uVar3 = uVar3 + 1;
LAB_002e346c:
    uVar5 = uVar5 + 1;
    if (uVar5 == (uVar4 & 0x7fffffff)) {
      return uVar3;
    }
  } while( true );
}

Assistant:

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  uint4 res = 0;
  for(int4 i=0;i<op->numInput();++i) {
    Varnode *vn = op->getIn(i);
    for(;;) {
      if (vn->isMark()) {
	res += 1;
	break;
      }
      if (!vn->isWritten()) break;
      PcodeOp *defOp = vn->getDef();
      if (defOp == op) {	// We have looped all the way around
	res += 1;
	break;
      }
      else if (defOp->code() != CPUI_INDIRECT)	// Chain up through INDIRECTs
	break;
      vn = vn->getDef()->getIn(0);
    }
  }
  return res;
}